

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadInitExpr(BinaryReader *this,Index index,bool require_i32)

{
  bool bVar1;
  Result RVar2;
  int iVar3;
  undefined7 in_register_00000011;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar4;
  ulong uStack_48;
  uint32_t value;
  uint32_t uStack_3c;
  Opcode local_2c [2];
  Opcode opcode;
  
  RVar2 = ReadOpcode(this,local_2c,(char *)CONCAT71(in_register_00000011,require_i32));
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  bVar1 = Opcode::IsEnabled(local_2c,&this->options_->features);
  if (!bVar1) {
    pcVar4 = (char *)0x0;
    goto LAB_00f415bd;
  }
  if ((int)local_2c[0].enum_ < 0x34) {
    if (local_2c[0].enum_ == End) {
      return (Result)Ok;
    }
    if (local_2c[0].enum_ != GetGlobal) {
LAB_00f4167c:
      pcVar4 = "in initializer expression";
LAB_00f415bd:
      RVar2 = ReportUnexpectedOpcode(this,local_2c[0],pcVar4);
      return (Result)RVar2.enum_;
    }
    RVar2 = ReadU32Leb128(this,(uint32_t *)&stack0xffffffffffffffb8,"init_expr get_global index");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb2])
                      (this->delegate_,(ulong)index,uStack_48 & 0xffffffff);
    pcVar4 = extraout_RDX_00;
    if (iVar3 != 0) {
      pcVar4 = "OnInitExprGetGlobalExpr callback failed";
      goto LAB_00f417a7;
    }
  }
  else {
    switch(local_2c[0].enum_) {
    case I32Const:
      uStack_48 = (ulong)uStack_48._4_4_ << 0x20;
      RVar2 = ReadS32Leb128(this,(uint32_t *)&stack0xffffffffffffffb8,"init_expr i32.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb3])
                        (this->delegate_,(ulong)index,uStack_48 & 0xffffffff);
      pcVar4 = extraout_RDX;
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprI32ConstExpr callback failed";
        goto LAB_00f417a7;
      }
      break;
    case I64Const:
      uStack_48 = 0;
      RVar2 = ReadS64Leb128(this,&stack0xffffffffffffffb8,"init_expr i64.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb4])
                        (this->delegate_,(ulong)index,uStack_48);
      pcVar4 = extraout_RDX_04;
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprI64ConstExpr callback failed";
        goto LAB_00f417a7;
      }
      break;
    case F32Const:
      uStack_48 = (ulong)uStack_48._4_4_ << 0x20;
      RVar2 = ReadT<unsigned_int>(this,(uint *)&stack0xffffffffffffffb8,"float",
                                  "init_expr f32.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaf])
                        (this->delegate_,(ulong)index,uStack_48 & 0xffffffff);
      pcVar4 = extraout_RDX_02;
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprF32ConstExpr callback failed";
        goto LAB_00f417a7;
      }
      break;
    case F64Const:
      uStack_48 = 0;
      RVar2 = ReadF64(this,&stack0xffffffffffffffb8,"init_expr f64.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb0])
                        (this->delegate_,(ulong)index,uStack_48);
      pcVar4 = extraout_RDX_03;
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprF64ConstExpr callback failed";
        goto LAB_00f417a7;
      }
      break;
    default:
      if (local_2c[0].enum_ != V128Const) goto LAB_00f4167c;
      uStack_48 = 0;
      value = 0;
      uStack_3c = 0;
      RVar2 = ReadV128(this,(v128 *)&stack0xffffffffffffffb8,"init_expr v128.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb1])
                        (this->delegate_,(ulong)index,uStack_48,_value);
      pcVar4 = extraout_RDX_01;
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprV128ConstExpr callback failed";
        goto LAB_00f417a7;
      }
    }
  }
  if (((require_i32) && (local_2c[0].enum_ != GetGlobal)) && (local_2c[0].enum_ != I32Const)) {
    pcVar4 = "expected i32 init_expr";
  }
  else {
    RVar2 = ReadOpcode(this,local_2c,pcVar4);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    if (local_2c[0].enum_ == End) {
      return (Result)Ok;
    }
    pcVar4 = "expected END opcode after initializer expression";
  }
LAB_00f417a7:
  PrintError(this,pcVar4);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadInitExpr(Index index, bool require_i32) {
  Opcode opcode;
  CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
  ERROR_UNLESS_OPCODE_ENABLED(opcode);

  switch (opcode) {
    case Opcode::I32Const: {
      uint32_t value = 0;
      CHECK_RESULT(ReadS32Leb128(&value, "init_expr i32.const value"));
      CALLBACK(OnInitExprI32ConstExpr, index, value);
      break;
    }

    case Opcode::I64Const: {
      uint64_t value = 0;
      CHECK_RESULT(ReadS64Leb128(&value, "init_expr i64.const value"));
      CALLBACK(OnInitExprI64ConstExpr, index, value);
      break;
    }

    case Opcode::F32Const: {
      uint32_t value_bits = 0;
      CHECK_RESULT(ReadF32(&value_bits, "init_expr f32.const value"));
      CALLBACK(OnInitExprF32ConstExpr, index, value_bits);
      break;
    }

    case Opcode::F64Const: {
      uint64_t value_bits = 0;
      CHECK_RESULT(ReadF64(&value_bits, "init_expr f64.const value"));
      CALLBACK(OnInitExprF64ConstExpr, index, value_bits);
      break;
    }

    case Opcode::V128Const: {
      v128 value_bits;
      ZeroMemory(value_bits);
      CHECK_RESULT(ReadV128(&value_bits, "init_expr v128.const value"));
      CALLBACK(OnInitExprV128ConstExpr, index, value_bits);
      break;
    }

    case Opcode::GetGlobal: {
      Index global_index;
      CHECK_RESULT(ReadIndex(&global_index, "init_expr get_global index"));
      CALLBACK(OnInitExprGetGlobalExpr, index, global_index);
      break;
    }

    case Opcode::End:
      return Result::Ok;

    default:
      return ReportUnexpectedOpcode(opcode, "in initializer expression");
  }

  if (require_i32 && opcode != Opcode::I32Const &&
      opcode != Opcode::GetGlobal) {
    PrintError("expected i32 init_expr");
    return Result::Error;
  }

  CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
  ERROR_UNLESS(opcode == Opcode::End,
               "expected END opcode after initializer expression");
  return Result::Ok;
}